

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resStrash.c
# Opt level: O3

Abc_Ntk_t * Res_WndStrash(Res_Win_t *p)

{
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 *paVar1;
  void *pvVar2;
  Abc_Ntk_t *pAVar3;
  int iVar4;
  Abc_Ntk_t *pNtk;
  char *pcVar5;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pAVar7;
  Vec_Ptr_t *vPairs;
  void **ppvVar8;
  int *__s;
  Vec_Ptr_t *pVVar9;
  int Fill;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  
  if (p->pNode->pNtk->ntkFunc != ABC_FUNC_AIG) {
    __assert_fail("Abc_NtkHasAig(p->pNode->pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resStrash.c"
                  ,0x37,"Abc_Ntk_t *Res_WndStrash(Res_Win_t *)");
  }
  pNtk = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  pcVar5 = Extra_UtilStrsav("window");
  pNtk->pName = pcVar5;
  pVVar9 = p->vLeaves;
  if (0 < pVVar9->nSize) {
    lVar11 = 0;
    do {
      pvVar2 = pVVar9->pArray[lVar11];
      pAVar6 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
      *(Abc_Obj_t **)((long)pvVar2 + 0x40) = pAVar6;
      lVar11 = lVar11 + 1;
      pVVar9 = p->vLeaves;
    } while (lVar11 < pVVar9->nSize);
  }
  pVVar9 = p->vBranches;
  if (0 < pVVar9->nSize) {
    lVar11 = 0;
    do {
      pvVar2 = pVVar9->pArray[lVar11];
      pAVar6 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
      *(Abc_Obj_t **)((long)pvVar2 + 0x40) = pAVar6;
      lVar11 = lVar11 + 1;
      pVVar9 = p->vBranches;
    } while (lVar11 < pVVar9->nSize);
  }
  pVVar9 = p->vNodes;
  if (0 < pVVar9->nSize) {
    lVar11 = 0;
    do {
      pAVar6 = (Abc_Obj_t *)pVVar9->pArray[lVar11];
      pAVar7 = Abc_ConvertAigToAig(pNtk,pAVar6);
      (pAVar6->field_6).pCopy = pAVar7;
      if (pAVar6 == p->pNode) {
        (pAVar6->field_6).pTemp = (void *)((ulong)pAVar7 ^ 1);
      }
      lVar11 = lVar11 + 1;
      pVVar9 = p->vNodes;
    } while (lVar11 < pVVar9->nSize);
  }
  pVVar9 = p->vRoots;
  iVar4 = pVVar9->nSize;
  vPairs = (Vec_Ptr_t *)malloc(0x10);
  uVar15 = 8;
  if (6 < iVar4 * 2 - 1U) {
    uVar15 = (ulong)(uint)(iVar4 * 2);
  }
  vPairs->nSize = 0;
  iVar13 = (int)uVar15;
  vPairs->nCap = iVar13;
  if (iVar13 == 0) {
    ppvVar8 = (void **)0x0;
  }
  else {
    ppvVar8 = (void **)malloc((long)iVar13 << 3);
  }
  vPairs->pArray = ppvVar8;
  if (iVar4 < 1) {
    uVar12 = 0;
  }
  else {
    uVar12 = 0;
    lVar11 = 0;
    do {
      pvVar2 = *(void **)(*(long *)((long)pVVar9->pArray + uVar12 * 4) + 0x40);
      uVar16 = (uint)uVar12;
      uVar14 = (uint)uVar15;
      if (uVar16 == uVar14) {
        if ((int)uVar14 < 0x10) {
          if (vPairs->pArray == (void **)0x0) {
            ppvVar8 = (void **)malloc(0x80);
          }
          else {
            ppvVar8 = (void **)realloc(vPairs->pArray,0x80);
          }
          uVar15 = 0x10;
        }
        else {
          uVar15 = (ulong)(uVar14 * 2);
          if (vPairs->pArray == (void **)0x0) {
            ppvVar8 = (void **)malloc(uVar15 * 8);
          }
          else {
            ppvVar8 = (void **)realloc(vPairs->pArray,uVar15 * 8);
          }
        }
        vPairs->pArray = ppvVar8;
        vPairs->nCap = (int)uVar15;
        uVar16 = uVar16 + 1;
        vPairs->nSize = uVar16;
        ppvVar8[uVar12] = pvVar2;
LAB_0046d513:
        uVar17 = (ulong)uVar16;
        ppvVar8 = vPairs->pArray;
      }
      else {
        uVar17 = uVar12 + 1;
        vPairs->pArray[uVar12] = pvVar2;
        if ((uint)uVar17 != uVar14) {
          uVar16 = uVar16 | 1;
          goto LAB_0046d513;
        }
        if (uVar16 < 0xf) {
          if (vPairs->pArray == (void **)0x0) {
            ppvVar8 = (void **)malloc(0x80);
          }
          else {
            ppvVar8 = (void **)realloc(vPairs->pArray,0x80);
          }
          vPairs->pArray = ppvVar8;
          vPairs->nCap = 0x10;
          uVar15 = 0x10;
        }
        else {
          uVar15 = (ulong)(uVar14 * 2);
          if (vPairs->pArray == (void **)0x0) {
            ppvVar8 = (void **)malloc(uVar15 * 8);
          }
          else {
            ppvVar8 = (void **)realloc(vPairs->pArray,uVar15 * 8);
          }
          vPairs->pArray = ppvVar8;
          vPairs->nCap = uVar14 * 2;
        }
      }
      uVar12 = uVar12 + 2;
      vPairs->nSize = (int)uVar12;
      ppvVar8[uVar17 & 0xffffffff] = (void *)0x0;
      lVar11 = lVar11 + 1;
      pVVar9 = p->vRoots;
    } while (lVar11 < pVVar9->nSize);
  }
  pAVar6 = p->pNode;
  pAVar3 = pAVar6->pNtk;
  if ((pAVar3->vTravIds).pArray == (int *)0x0) {
    iVar4 = pAVar3->vObjs->nSize;
    uVar15 = (long)iVar4 + 500;
    iVar13 = (int)uVar15;
    if ((pAVar3->vTravIds).nCap < iVar13) {
      __s = (int *)malloc(uVar15 * 4);
      (pAVar3->vTravIds).pArray = __s;
      if (__s == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pAVar3->vTravIds).nCap = iVar13;
    }
    else {
      __s = (int *)0x0;
    }
    if (-500 < iVar4) {
      memset(__s,0,(uVar15 & 0xffffffff) << 2);
    }
    (pAVar3->vTravIds).nSize = iVar13;
  }
  iVar4 = pAVar3->nTravIds;
  pAVar3->nTravIds = iVar4 + 1;
  if (0x3ffffffe < iVar4) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                  ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  Res_WinSweepLeafTfo_rec(pAVar6,(*(uint *)&pAVar6->field_0x14 >> 0xc) + p->nWinTfoMax);
  paVar1 = &p->pNode->field_6;
  paVar1->pTemp = (void *)((ulong)paVar1->pTemp ^ 1);
  pAVar3 = p->pNode->pNtk;
  iVar4 = p->pNode->Id;
  iVar13 = pAVar3->nTravIds;
  Vec_IntFillExtra(&pAVar3->vTravIds,iVar4 + 1,Fill);
  if (((long)iVar4 < 0) || ((pAVar3->vTravIds).nSize <= iVar4)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  (pAVar3->vTravIds).pArray[iVar4] = iVar13 + -1;
  pVVar9 = p->vNodes;
  if (0 < pVVar9->nSize) {
    lVar11 = 0;
    uVar10 = extraout_RDX;
    do {
      pAVar6 = (Abc_Obj_t *)pVVar9->pArray[lVar11];
      pAVar3 = pAVar6->pNtk;
      iVar4 = pAVar6->Id;
      Vec_IntFillExtra(&pAVar3->vTravIds,iVar4 + 1,(int)uVar10);
      if (((long)iVar4 < 0) || ((pAVar3->vTravIds).nSize <= iVar4)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar10 = extraout_RDX_00;
      if ((pAVar3->vTravIds).pArray[iVar4] == pAVar6->pNtk->nTravIds) {
        pAVar7 = Abc_ConvertAigToAig(pNtk,pAVar6);
        (pAVar6->field_6).pCopy = pAVar7;
        uVar10 = extraout_RDX_01;
      }
      lVar11 = lVar11 + 1;
      pVVar9 = p->vNodes;
    } while (lVar11 < pVVar9->nSize);
  }
  pVVar9 = p->vRoots;
  if (0 < pVVar9->nSize) {
    uVar15 = 1;
    lVar11 = 0;
    do {
      if (uVar12 <= uVar15) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
      }
      vPairs->pArray[uVar15] = *(void **)(*(long *)((long)pVVar9->pArray + uVar15 * 4 + -4) + 0x40);
      lVar11 = lVar11 + 1;
      pVVar9 = p->vRoots;
      uVar15 = uVar15 + 2;
    } while (lVar11 < pVVar9->nSize);
  }
  pAVar6 = Abc_AigMiter((Abc_Aig_t *)pNtk->pManFunc,vPairs,0);
  pAVar7 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
  Abc_ObjAddFanin(pAVar7,pAVar6);
  if (vPairs->pArray != (void **)0x0) {
    free(vPairs->pArray);
  }
  free(vPairs);
  pAVar6 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
  Abc_ObjAddFanin(pAVar6,(p->pNode->field_6).pCopy);
  pAVar6 = p->pNode;
  if (0 < (pAVar6->vFanins).nSize) {
    lVar11 = 0;
    do {
      pvVar2 = pAVar6->pNtk->vObjs->pArray[(pAVar6->vFanins).pArray[lVar11]];
      pAVar6 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
      Abc_ObjAddFanin(pAVar6,*(Abc_Obj_t **)((long)pvVar2 + 0x40));
      lVar11 = lVar11 + 1;
      pAVar6 = p->pNode;
    } while (lVar11 < (pAVar6->vFanins).nSize);
  }
  pVVar9 = p->vDivs;
  if (0 < pVVar9->nSize) {
    lVar11 = 0;
    do {
      pvVar2 = pVVar9->pArray[lVar11];
      pAVar6 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
      Abc_ObjAddFanin(pAVar6,*(Abc_Obj_t **)((long)pvVar2 + 0x40));
      lVar11 = lVar11 + 1;
      pVVar9 = p->vDivs;
    } while (lVar11 < pVVar9->nSize);
  }
  Abc_NtkAddDummyPiNames(pNtk);
  Abc_NtkAddDummyPoNames(pNtk);
  iVar4 = Abc_NtkCheck(pNtk);
  if (iVar4 == 0) {
    fwrite("Res_WndStrash(): Network check has failed.\n",0x2b,1,_stdout);
  }
  return pNtk;
}

Assistant:

Abc_Ntk_t * Res_WndStrash( Res_Win_t * p )
{
    Vec_Ptr_t * vPairs;
    Abc_Ntk_t * pAig;
    Abc_Obj_t * pObj, * pMiter;
    int i;
    assert( Abc_NtkHasAig(p->pNode->pNtk) );
//    Abc_NtkCleanCopy( p->pNode->pNtk );
    // create the network
    pAig = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    pAig->pName = Extra_UtilStrsav( "window" );
    // create the inputs
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vLeaves, pObj, i )
        pObj->pCopy = Abc_NtkCreatePi( pAig );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vBranches, pObj, i )
        pObj->pCopy = Abc_NtkCreatePi( pAig );
    // go through the nodes in the topological order
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vNodes, pObj, i )
    {
        pObj->pCopy = Abc_ConvertAigToAig( pAig, pObj );
        if ( pObj == p->pNode )
            pObj->pCopy = Abc_ObjNot( pObj->pCopy );
    }
    // collect the POs
    vPairs = Vec_PtrAlloc( 2 * Vec_PtrSize(p->vRoots) );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vRoots, pObj, i )
    {
        Vec_PtrPush( vPairs, pObj->pCopy );
        Vec_PtrPush( vPairs, NULL );
    }
    // mark the TFO of the node
    Abc_NtkIncrementTravId( p->pNode->pNtk );
    Res_WinSweepLeafTfo_rec( p->pNode, (int)p->pNode->Level + p->nWinTfoMax );
    // update strashing of the node
    p->pNode->pCopy = Abc_ObjNot( p->pNode->pCopy );
    Abc_NodeSetTravIdPrevious( p->pNode );
    // redo strashing in the TFO
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vNodes, pObj, i )
    {
        if ( Abc_NodeIsTravIdCurrent(pObj) )
            pObj->pCopy = Abc_ConvertAigToAig( pAig, pObj );
    }
    // collect the POs
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vRoots, pObj, i )
        Vec_PtrWriteEntry( vPairs, 2 * i + 1, pObj->pCopy );
    // add the miter
    pMiter = Abc_AigMiter( (Abc_Aig_t *)pAig->pManFunc, vPairs, 0 );
    Abc_ObjAddFanin( Abc_NtkCreatePo(pAig), pMiter );
    Vec_PtrFree( vPairs );
    // add the node
    Abc_ObjAddFanin( Abc_NtkCreatePo(pAig), p->pNode->pCopy );
    // add the fanins
    Abc_ObjForEachFanin( p->pNode, pObj, i )
        Abc_ObjAddFanin( Abc_NtkCreatePo(pAig), pObj->pCopy );
    // add the divisors
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vDivs, pObj, i )
        Abc_ObjAddFanin( Abc_NtkCreatePo(pAig), pObj->pCopy );
    // add the names
    Abc_NtkAddDummyPiNames( pAig );
    Abc_NtkAddDummyPoNames( pAig );
    // check the resulting network
    if ( !Abc_NtkCheck( pAig ) )
        fprintf( stdout, "Res_WndStrash(): Network check has failed.\n" );
    return pAig;
}